

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListModel::insert(QListModel *this,int row,QListWidgetItem *item)

{
  bool bVar1;
  QListWidget *pQVar2;
  iterator j;
  Promoted<long_long,_int> PVar3;
  long lVar4;
  qsizetype qVar5;
  parameter_type in_RDX;
  int in_ESI;
  QListWidget *in_RDI;
  long in_FS_OFFSET;
  iterator it;
  undefined8 in_stack_ffffffffffffff78;
  SortOrder order;
  QList<QListWidgetItem_*> *in_stack_ffffffffffffff88;
  int local_5c;
  undefined1 local_50 [8];
  QListWidgetItem *in_stack_ffffffffffffffb8;
  int local_34;
  qsizetype local_30;
  QListWidgetItem **local_28;
  QListWidgetItem **local_20;
  QListWidgetItem **local_18;
  iterator local_10;
  long local_8;
  
  order = (SortOrder)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (parameter_type)0x0) {
    pQVar2 = view((QListModel *)0x899a3b);
    in_RDX->view = pQVar2;
    if ((in_RDX->view == (QListWidget *)0x0) ||
       (bVar1 = QListWidget::isSortingEnabled(in_RDI), !bVar1)) {
      if (in_ESI < 0) {
        local_5c = 0;
      }
      else {
        lVar4 = (long)in_ESI;
        qVar5 = QList<QListWidgetItem_*>::size
                          ((QList<QListWidgetItem_*> *)
                           &(in_RDI->super_QListView).super_QAbstractItemView.
                            super_QAbstractScrollArea.super_QFrame.super_QWidget.super_QPaintDevice)
        ;
        local_5c = in_ESI;
        if (qVar5 < lVar4) {
          qVar5 = QList<QListWidgetItem_*>::size
                            ((QList<QListWidgetItem_*> *)
                             &(in_RDI->super_QListView).super_QAbstractItemView.
                              super_QAbstractScrollArea.super_QFrame.super_QWidget.
                              super_QPaintDevice);
          local_5c = (int)qVar5;
        }
      }
    }
    else {
      local_10.i = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
      QList<QListWidgetItem_*>::iterator::iterator(&local_10);
      local_20 = (QListWidgetItem **)
                 QList<QListWidgetItem_*>::begin((QList<QListWidgetItem_*> *)in_RDI);
      local_28 = (QListWidgetItem **)
                 QList<QListWidgetItem_*>::end((QList<QListWidgetItem_*> *)in_RDI);
      QListWidget::sortOrder(in_RDI);
      local_18 = (QListWidgetItem **)
                 sortedInsertionIterator
                           ((iterator *)in_stack_ffffffffffffff88,(iterator *)in_RDI,order,
                            in_stack_ffffffffffffffb8);
      local_10 = (iterator)local_18;
      j = QList<QListWidgetItem_*>::begin((QList<QListWidgetItem_*> *)in_RDI);
      local_30 = QList<QListWidgetItem_*>::iterator::operator-(&local_10,j);
      local_34 = 0;
      PVar3 = qMax<long_long,int>(&local_30,&local_34);
      local_5c = (int)PVar3;
    }
    QModelIndex::QModelIndex((QModelIndex *)0x899b75);
    QAbstractItemModel::beginInsertRows((QModelIndex *)in_RDI,(int)local_50,local_5c);
    QList<QListWidgetItem_*>::insert(in_stack_ffffffffffffff88,(qsizetype)in_RDI,in_RDX);
    in_RDX->d->theid = local_5c;
    QAbstractItemModel::endInsertRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModel::insert(int row, QListWidgetItem *item)
{
    if (!item)
        return;

    item->view = this->view();
    if (item->view && item->view->isSortingEnabled()) {
        // sorted insertion
        QList<QListWidgetItem*>::iterator it;
        it = sortedInsertionIterator(items.begin(), items.end(),
                                     item->view->sortOrder(), item);
        row = qMax<qsizetype>(it - items.begin(), 0);
    } else {
        if (row < 0)
            row = 0;
        else if (row > items.size())
            row = items.size();
    }
    beginInsertRows(QModelIndex(), row, row);
    items.insert(row, item);
    item->d->theid = row;
    endInsertRows();
}